

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

void Ivy_FraigAddClausesMux(Ivy_FraigMan_t *p,Ivy_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  int v;
  int v_00;
  uint c;
  uint c_00;
  int iVar3;
  Ivy_Obj_t *pIVar4;
  int fCompE;
  int fCompT;
  int VarE;
  int VarT;
  int VarI;
  int VarF;
  int RetValue;
  int pLits [4];
  Ivy_Obj_t *local_30;
  Ivy_Obj_t *pNodeE;
  Ivy_Obj_t *pNodeT;
  Ivy_Obj_t *pNodeI;
  Ivy_Obj_t *pNode_local;
  Ivy_FraigMan_t *p_local;
  
  pNodeI = pNode;
  pNode_local = (Ivy_Obj_t *)p;
  iVar1 = Ivy_IsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Ivy_IsComplement( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                  ,0x935,"void Ivy_FraigAddClausesMux(Ivy_FraigMan_t *, Ivy_Obj_t *)");
  }
  iVar1 = Ivy_ObjIsMuxType(pNodeI);
  if (iVar1 == 0) {
    __assert_fail("Ivy_ObjIsMuxType( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                  ,0x936,"void Ivy_FraigAddClausesMux(Ivy_FraigMan_t *, Ivy_Obj_t *)");
  }
  pNodeT = Ivy_ObjRecognizeMux(pNodeI,&pNodeE,&local_30);
  iVar1 = Ivy_ObjSatNum(pNodeI);
  iVar2 = Ivy_ObjSatNum(pNodeT);
  pIVar4 = Ivy_Regular(pNodeE);
  v = Ivy_ObjSatNum(pIVar4);
  pIVar4 = Ivy_Regular(local_30);
  v_00 = Ivy_ObjSatNum(pIVar4);
  c = Ivy_IsComplement(pNodeE);
  c_00 = Ivy_IsComplement(local_30);
  VarF = toLitCond(iVar2,1);
  RetValue = toLitCond(v,c ^ 1);
  pLits[0] = toLitCond(iVar1,0);
  iVar3 = sat_solver_addclause((sat_solver *)pNode_local[1].pPrevFan1,&VarF,pLits + 1);
  if (iVar3 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                  ,0x94e,"void Ivy_FraigAddClausesMux(Ivy_FraigMan_t *, Ivy_Obj_t *)");
  }
  VarF = toLitCond(iVar2,1);
  RetValue = toLitCond(v,c);
  pLits[0] = toLitCond(iVar1,1);
  iVar3 = sat_solver_addclause((sat_solver *)pNode_local[1].pPrevFan1,&VarF,pLits + 1);
  if (iVar3 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                  ,0x953,"void Ivy_FraigAddClausesMux(Ivy_FraigMan_t *, Ivy_Obj_t *)");
  }
  VarF = toLitCond(iVar2,0);
  RetValue = toLitCond(v_00,c_00 ^ 1);
  pLits[0] = toLitCond(iVar1,0);
  iVar3 = sat_solver_addclause((sat_solver *)pNode_local[1].pPrevFan1,&VarF,pLits + 1);
  if (iVar3 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                  ,0x958,"void Ivy_FraigAddClausesMux(Ivy_FraigMan_t *, Ivy_Obj_t *)");
  }
  VarF = toLitCond(iVar2,0);
  RetValue = toLitCond(v_00,c_00);
  pLits[0] = toLitCond(iVar1,1);
  iVar2 = sat_solver_addclause((sat_solver *)pNode_local[1].pPrevFan1,&VarF,pLits + 1);
  if (iVar2 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                  ,0x95d,"void Ivy_FraigAddClausesMux(Ivy_FraigMan_t *, Ivy_Obj_t *)");
  }
  if (v != v_00) {
    VarF = toLitCond(v,c);
    RetValue = toLitCond(v_00,c_00);
    pLits[0] = toLitCond(iVar1,1);
    iVar2 = sat_solver_addclause((sat_solver *)pNode_local[1].pPrevFan1,&VarF,pLits + 1);
    if (iVar2 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                    ,0x970,"void Ivy_FraigAddClausesMux(Ivy_FraigMan_t *, Ivy_Obj_t *)");
    }
    VarF = toLitCond(v,c ^ 1);
    RetValue = toLitCond(v_00,c_00 ^ 1);
    pLits[0] = toLitCond(iVar1,0);
    iVar1 = sat_solver_addclause((sat_solver *)pNode_local[1].pPrevFan1,&VarF,pLits + 1);
    if (iVar1 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                    ,0x975,"void Ivy_FraigAddClausesMux(Ivy_FraigMan_t *, Ivy_Obj_t *)");
    }
  }
  return;
}

Assistant:

void Ivy_FraigAddClausesMux( Ivy_FraigMan_t * p, Ivy_Obj_t * pNode )
{
    Ivy_Obj_t * pNodeI, * pNodeT, * pNodeE;
    int pLits[4], RetValue, VarF, VarI, VarT, VarE, fCompT, fCompE;

    assert( !Ivy_IsComplement( pNode ) );
    assert( Ivy_ObjIsMuxType( pNode ) );
    // get nodes (I = if, T = then, E = else)
    pNodeI = Ivy_ObjRecognizeMux( pNode, &pNodeT, &pNodeE );
    // get the variable numbers
    VarF = Ivy_ObjSatNum(pNode);
    VarI = Ivy_ObjSatNum(pNodeI);
    VarT = Ivy_ObjSatNum(Ivy_Regular(pNodeT));
    VarE = Ivy_ObjSatNum(Ivy_Regular(pNodeE));
    // get the complementation flags
    fCompT = Ivy_IsComplement(pNodeT);
    fCompE = Ivy_IsComplement(pNodeE);

    // f = ITE(i, t, e)

    // i' + t' + f
    // i' + t  + f'
    // i  + e' + f
    // i  + e  + f'

    // create four clauses
    pLits[0] = toLitCond(VarI, 1);
    pLits[1] = toLitCond(VarT, 1^fCompT);
    pLits[2] = toLitCond(VarF, 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 1);
    pLits[1] = toLitCond(VarT, 0^fCompT);
    pLits[2] = toLitCond(VarF, 1);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 0);
    pLits[1] = toLitCond(VarE, 1^fCompE);
    pLits[2] = toLitCond(VarF, 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 0);
    pLits[1] = toLitCond(VarE, 0^fCompE);
    pLits[2] = toLitCond(VarF, 1);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );

    // two additional clauses
    // t' & e' -> f'
    // t  & e  -> f 

    // t  + e   + f'
    // t' + e'  + f 

    if ( VarT == VarE )
    {
//        assert( fCompT == !fCompE );
        return;
    }

    pLits[0] = toLitCond(VarT, 0^fCompT);
    pLits[1] = toLitCond(VarE, 0^fCompE);
    pLits[2] = toLitCond(VarF, 1);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarT, 1^fCompT);
    pLits[1] = toLitCond(VarE, 1^fCompE);
    pLits[2] = toLitCond(VarF, 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
}